

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O2

void UCNV_FROM_U_CALLBACK_ESCAPE_63
               (void *context,UConverterFromUnicodeArgs *fromArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  UErrorCode UVar4;
  ulong uVar5;
  ulong uVar6;
  UErrorCode err2;
  UConverterFromUnicodeArgs *local_c8;
  UConverterFromUCallback original;
  UConverterFromUCallback ignoredCallback;
  void *originalContext;
  UChar valueString [48];
  void *ignoredContext;
  UChar *local_38;
  
  err2 = U_ZERO_ERROR;
  original = (UConverterFromUCallback)0x0;
  ignoredCallback = (UConverterFromUCallback)0x0;
  if (2 < (int)reason) {
    return;
  }
  if (reason == UCNV_UNASSIGNED) {
    UVar4 = U_ZERO_ERROR;
    if (((((codePoint - 0x200bU < 0x24) &&
          ((0xf8000001fU >> ((ulong)(codePoint - 0x200bU) & 0x3f) & 1) != 0)) ||
         (codePoint - 0x180bU < 4)) ||
        (((codePoint - 0x115fU < 2 || (codePoint - 0x17b4U < 2)) ||
         ((codePoint == 0xad || ((codePoint == 0x34f || (codePoint == 0x61c)))))))) ||
       ((codePoint == 0x3164 || (codePoint & 0xfffffff0U) == 0x2060 ||
        ((((((codePoint & 0xfffff000U) == 0xe0000 || (codePoint - 0x1d173U < 8)) ||
           ((codePoint & 0xfffffffcU) == 0x1bca0)) ||
          ((codePoint - 0xfff0U < 9 || (codePoint == 0xffa0)))) ||
         ((codePoint == 0xfeff || ((codePoint & 0xfffffff0U) == 0xfe00)))))))) goto LAB_002a4b75;
  }
  ucnv_setFromUCallBack_63
            (fromArgs->converter,UCNV_FROM_U_CALLBACK_SUBSTITUTE_63,(void *)0x0,&original,
             &originalContext,&err2);
  UVar4 = err2;
  if (err2 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (context == (void *)0x0) {
      uVar6 = 0;
      uVar5 = (ulong)(uint)length;
      if (length < 1) {
        uVar5 = uVar6;
      }
      iVar3 = 0;
      local_c8 = fromArgs;
      for (; fromArgs = local_c8, uVar5 != uVar6; uVar6 = uVar6 + 1) {
        (valueString + iVar3)[0] = L'%';
        (valueString + iVar3)[1] = L'U';
        iVar2 = uprv_itou_63(valueString + (long)iVar3 + 2,0x2e - iVar3,
                             (uint)(ushort)codeUnits[uVar6],0x10,4);
        iVar3 = iVar2 + iVar3 + 2;
      }
    }
    else {
      cVar1 = *context;
      if (cVar1 == 'C') {
        if (length == 2) {
          valueString[0] = L'\\';
          valueString[1] = L'U';
          iVar2 = 8;
        }
        else {
          valueString[0] = L'\\';
          valueString[1] = L'u';
          codePoint = (UChar32)(ushort)*codeUnits;
          iVar2 = 4;
        }
        iVar2 = uprv_itou_63(valueString + 2,0x2e,codePoint,0x10,iVar2);
        iVar3 = iVar2 + 2;
      }
      else if (cVar1 == 'D') {
        valueString[0] = L'&';
        valueString[1] = L'#';
        if (length != 2) {
          codePoint = (UChar32)(ushort)*codeUnits;
        }
        iVar2 = uprv_itou_63(valueString + 2,0x2e,codePoint,10,0);
        iVar3 = iVar2 + 3;
        valueString[(long)iVar2 + 2] = L';';
      }
      else if (cVar1 == 'X') {
        valueString[0] = L'&';
        valueString[1] = L'#';
        valueString[2] = L'x';
        if (length != 2) {
          codePoint = (UChar32)(ushort)*codeUnits;
        }
        iVar2 = uprv_itou_63(valueString + 3,0x2d,codePoint,0x10,0);
        iVar3 = iVar2 + 4;
        valueString[(long)iVar2 + 3] = L';';
      }
      else if (cVar1 == 'S') {
        valueString[0] = L'\\';
        iVar2 = uprv_itou_63(valueString + 1,0x2f,codePoint,0x10,0);
        iVar3 = iVar2 + 2;
        valueString[(long)iVar2 + 1] = L' ';
      }
      else if (cVar1 == 'U') {
        valueString[0] = L'{';
        valueString[1] = L'U';
        valueString[2] = L'+';
        if (length != 2) {
          codePoint = (UChar32)(ushort)*codeUnits;
        }
        iVar2 = uprv_itou_63(valueString + 3,0x2d,codePoint,0x10,4);
        iVar3 = iVar2 + 4;
        valueString[(long)iVar2 + 3] = L'}';
      }
      else {
        uVar5 = 0;
        if (cVar1 == 'J') {
          uVar6 = (ulong)(uint)length;
          if (length < 1) {
            uVar6 = uVar5;
          }
          iVar3 = 0;
          local_c8 = fromArgs;
          for (; fromArgs = local_c8, uVar6 != uVar5; uVar5 = uVar5 + 1) {
            (valueString + iVar3)[0] = L'\\';
            (valueString + iVar3)[1] = L'u';
            iVar2 = uprv_itou_63(valueString + (long)iVar3 + 2,0x2e - iVar3,
                                 (uint)(ushort)codeUnits[uVar5],0x10,4);
            iVar3 = iVar2 + iVar3 + 2;
          }
        }
        else {
          uVar6 = (ulong)(uint)length;
          if (length < 1) {
            uVar6 = uVar5;
          }
          iVar3 = 0;
          local_c8 = fromArgs;
          for (; fromArgs = local_c8, uVar6 != uVar5; uVar5 = uVar5 + 1) {
            (valueString + iVar3)[0] = L'%';
            (valueString + iVar3)[1] = L'U';
            iVar2 = uprv_itou_63(valueString + (long)iVar3 + 2,0x2e - iVar3,
                                 (uint)(ushort)codeUnits[uVar5],0x10,4);
            iVar3 = iVar2 + iVar3 + 2;
          }
        }
      }
    }
    local_38 = valueString;
    *err = U_ZERO_ERROR;
    ucnv_cbFromUWriteUChars_63(fromArgs,&local_38,valueString + iVar3,0,err);
    ucnv_setFromUCallBack_63
              (fromArgs->converter,original,originalContext,&ignoredCallback,&ignoredContext,&err2);
    UVar4 = err2;
    if (err2 < U_ILLEGAL_ARGUMENT_ERROR) {
      return;
    }
  }
LAB_002a4b75:
  *err = UVar4;
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_ESCAPE (
                         const void *context,
                         UConverterFromUnicodeArgs *fromArgs,
                         const UChar *codeUnits,
                         int32_t length,
                         UChar32 codePoint,
                         UConverterCallbackReason reason,
                         UErrorCode * err)
{

  UChar valueString[VALUE_STRING_LENGTH];
  int32_t valueStringLength = 0;
  int32_t i = 0;

  const UChar *myValueSource = NULL;
  UErrorCode err2 = U_ZERO_ERROR;
  UConverterFromUCallback original = NULL;
  const void *originalContext;

  UConverterFromUCallback ignoredCallback = NULL;
  const void *ignoredContext;
  
  if (reason > UCNV_IRREGULAR)
  {
      return;
  }
  else if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
  {
      /*
       * Skip if the codepoint has unicode property of default ignorable.
       */
      *err = U_ZERO_ERROR;
      return;
  }

  ucnv_setFromUCallBack (fromArgs->converter,
                     (UConverterFromUCallback) UCNV_FROM_U_CALLBACK_SUBSTITUTE,
                     NULL,
                     &original,
                     &originalContext,
                     &err2);
  
  if (U_FAILURE (err2))
  {
    *err = err2;
    return;
  } 
  if(context==NULL)
  { 
      while (i < length)
      {
        valueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT;  /* adding % */
        valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT; /* adding U */
        valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
      }
  }
  else
  {
      switch(*((char*)context))
      {
      case UCNV_PRV_ESCAPE_JAVA:
          while (i < length)
          {
              valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
              valueString[valueStringLength++] = (UChar) UNICODE_U_LOW_CODEPOINT; /* adding u */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
          }
          break;

      case UCNV_PRV_ESCAPE_C:
          valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */

          if(length==2){
              valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT; /* adding U */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 8);

          }
          else{
              valueString[valueStringLength++] = (UChar) UNICODE_U_LOW_CODEPOINT; /* adding u */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 4);
          }
          break;

      case UCNV_PRV_ESCAPE_XML_DEC:

          valueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
          valueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
          if(length==2){
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 10, 0);
          }
          else{
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 10, 0);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
          break;

      case UCNV_PRV_ESCAPE_XML_HEX:

          valueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
          valueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
          valueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
          if(length==2){
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 0);
          }
          else{
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 0);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
          break;

      case UCNV_PRV_ESCAPE_UNICODE:
          valueString[valueStringLength++] = (UChar) UNICODE_LEFT_CURLY_CODEPOINT;    /* adding { */
          valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT;    /* adding U */
          valueString[valueStringLength++] = (UChar) UNICODE_PLUS_CODEPOINT; /* adding + */
          if (length == 2) {
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 4);
          } else {
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 4);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_RIGHT_CURLY_CODEPOINT;    /* adding } */
          break;

      case UCNV_PRV_ESCAPE_CSS2:
          valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
          valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 0);
          /* Always add space character, becase the next character might be whitespace,
             which would erroneously be considered the termination of the escape sequence. */
          valueString[valueStringLength++] = (UChar) UNICODE_SPACE_CODEPOINT;
          break;

      default:
          while (i < length)
          {
              valueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT;  /* adding % */
              valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT;             /* adding U */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
          }
      }
  }  
  myValueSource = valueString;

  /* reset the error */
  *err = U_ZERO_ERROR;

  ucnv_cbFromUWriteUChars(fromArgs, &myValueSource, myValueSource+valueStringLength, 0, err);

  ucnv_setFromUCallBack (fromArgs->converter,
                         original,
                         originalContext,
                         &ignoredCallback,
                         &ignoredContext,
                         &err2);
  if (U_FAILURE (err2))
  {
      *err = err2;
      return;
  }

  return;
}